

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

size_t mpack_expect_key_cstr(mpack_reader_t *reader,char **keys,_Bool *found,size_t count)

{
  mpack_reader_t *pmVar1;
  size_t i;
  size_t count_local;
  _Bool *found_local;
  char **keys_local;
  mpack_reader_t *reader_local;
  
  pmVar1 = (mpack_reader_t *)mpack_expect_enum_optional(reader,keys,count);
  reader_local = (mpack_reader_t *)count;
  if (pmVar1 != (mpack_reader_t *)count) {
    if ((found[(long)pmVar1] & 1U) == 0) {
      found[(long)pmVar1] = true;
      reader_local = pmVar1;
    }
    else {
      mpack_reader_flag_error(reader,mpack_error_invalid);
      reader_local = (mpack_reader_t *)count;
    }
  }
  return (size_t)reader_local;
}

Assistant:

size_t mpack_expect_key_cstr(mpack_reader_t* reader, const char* keys[], bool found[], size_t count) {
    size_t i = mpack_expect_enum_optional(reader, keys, count);

    // unrecognized keys are fine, we just return count
    if (i == count)
        return count;

    // check if this key is a duplicate
    mpack_assert(found != NULL, "found cannot be NULL");
    if (found[i]) {
        mpack_reader_flag_error(reader, mpack_error_invalid);
        return count;
    }

    found[i] = true;
    return i;
}